

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O1

void __thiscall hmac_hash::SHA1::update(SHA1 *this,uchar *message,size_t length)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  size_t i_1;
  size_t i;
  long lVar4;
  ulong uVar5;
  uchar *puVar6;
  uint32_t block [16];
  uint32_t local_78 [18];
  
  puVar2 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)(this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start - (long)puVar2;
  if (lVar4 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = lVar4 + 0x40;
    if (length <= uVar5) {
      uVar5 = length;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_buffer,puVar2,message
               ,message + uVar5);
    puVar2 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 == 0x40) {
      lVar4 = 0;
      do {
        uVar1 = *(uint *)(puVar2 + lVar4 * 4);
        local_78[lVar4] =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      transform(this,local_78);
      puVar2 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish != puVar2) {
        (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
    }
  }
  if (uVar5 + 0x40 <= length) {
    puVar6 = message + uVar5 + 3;
    uVar3 = uVar5 + 0x40;
    do {
      uVar5 = uVar3;
      lVar4 = 0;
      do {
        uVar1 = *(uint *)(puVar6 + lVar4 * 4 + -3);
        local_78[lVar4] =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      transform(this,local_78);
      puVar6 = puVar6 + 0x40;
      uVar3 = uVar5 + 0x40;
    } while (uVar5 + 0x40 <= length);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_buffer,
             (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,message + uVar5,message + length);
  return;
}

Assistant:

void SHA1::update(const unsigned char *message, size_t length) {
        size_t offset = 0;

        // Fill buffer if it has existing bytes
        if (!m_buffer.empty()) {
            size_t to_copy = std::min(BLOCK_SIZE - m_buffer.size(), length);
            m_buffer.insert(m_buffer.end(), message, message + to_copy);
            offset += to_copy;

            if (m_buffer.size() == BLOCK_SIZE) {
                uint32_t block[16];
                buffer_to_block(m_buffer.data(), block);
                transform(block);
                m_buffer.clear();
            }
        }

        // Process full blocks directly from message
        while (offset + BLOCK_SIZE <= length) {
            uint32_t block[16];
            buffer_to_block(message + offset, block);
            transform(block);
            offset += BLOCK_SIZE;
        }

        // Store remaining bytes in buffer
        m_buffer.insert(m_buffer.end(), message + offset, message + length);
    }